

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O2

int varinfo_set_variant(varinfo *info,char *variant)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  vardata *pvVar3;
  char *__format;
  ulong uVar4;
  long lVar5;
  undefined8 uStack_28;
  int data;
  
  uStack_28 = in_RAX;
  iVar1 = symtab_get_t(info->data->symtab,variant,1,&data);
  if (iVar1 == -1) {
    __format = "no variant %s\n";
  }
  else {
    pvVar3 = info->data;
    iVar1 = pvVar3->variants[data].varset;
    if (info->variants[iVar1] == -1 || info->variants[iVar1] == data) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        if ((long)pvVar3->featuresnum <= (long)uVar4) {
          info->variants[iVar1] = data;
          mask_or(info->fmask,pvVar3->variants[data].fmask,pvVar3->featuresnum);
          return 0;
        }
        if ((info->fmask[uVar4 >> 5 & 0x7ffffff] >> ((uint)uVar4 & 0x1f) & 1) != 0) {
          iVar2 = mask_intersect(*(uint32_t **)((long)&pvVar3->features->cfmask + lVar5),
                                 pvVar3->variants[data].fmask,pvVar3->featuresnum);
          pvVar3 = info->data;
          if (iVar2 != -1) {
            fprintf(_stderr,"variant %s conflicts with feature %s\n",pvVar3->variants[data].name,
                    *(undefined8 *)((long)&pvVar3->features->name + lVar5));
            return -1;
          }
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x40;
      } while( true );
    }
    variant = pvVar3->varsets[iVar1].name;
    __format = "a variant from varset %s has already been selected\n";
  }
  fprintf(_stderr,__format,variant);
  return -1;
}

Assistant:

int varinfo_set_variant(struct varinfo *info, const char *variant) {
	int data;
	if (symtab_get_t(info->data->symtab, variant, VARDATA_ST_VARIANT, &data) == -1) {
		fprintf(stderr, "no variant %s\n", variant);
		return -1;
	}
	int varset = info->data->variants[data].varset;
	if (info->variants[varset] != -1 && info->variants[varset] != data) {
		fprintf(stderr, "a variant from varset %s has already been selected\n", info->data->varsets[varset].name);
		return -1;
	}
	int i;
	for (i = 0; i < info->data->featuresnum; i++) {
		if (mask_get(info->fmask, i) && mask_intersect(info->data->features[i].cfmask, info->data->variants[data].fmask, info->data->featuresnum) != -1) {
			fprintf(stderr, "variant %s conflicts with feature %s\n", info->data->variants[data].name, info->data->features[i].name);
			return -1;
		}
	}
	info->variants[varset] = data;
	mask_or(info->fmask, info->data->variants[data].fmask, info->data->featuresnum);
	return 0;
}